

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

void ProcessThread::wakeup(Signal sig)

{
  ssize_t sVar1;
  int *piVar2;
  char b;
  
  b = (sig == Stop) << 4 | 99;
  do {
    sVar1 = write(sProcessPipe[1],&b,1);
    if (-1 < sVar1) {
      return;
    }
    piVar2 = __errno_location();
  } while ((*piVar2 == 4) || (*piVar2 == 0xb));
  return;
}

Assistant:

void ProcessThread::wakeup(Signal sig)
{
    const char b = sig == Stop ? 's' : 'c';
    // printf("sending pid %d\n", pid);
    do {
        if (::write(sProcessPipe[1], &b, sizeof(char)) >= 0)
            break;
    } while (errno == EINTR || errno == EAGAIN || errno == EWOULDBLOCK);
    // printf("sent pid %ld\n", written);
}